

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
BuildingInfoIRCCommand::trigger
          (BuildingInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  int iVar1;
  long *plVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  long lVar6;
  _If_sv<std::basic_string_view<char>,_size_type> _Var7;
  char *pcVar8;
  size_t sVar9;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar10;
  long *plVar11;
  long *plVar12;
  allocator<char> local_c1;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cStrings;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oStrings;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nStrings;
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gStrings;
  long *local_78;
  long *local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string str;
  
  pcVar8 = channel._M_str;
  sVar9 = channel._M_len;
  lVar6 = Jupiter::IRC::Client::getChannel(source,sVar9,pcVar8,pcVar8,nick._M_len,nick._M_str);
  if (lVar6 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    gStrings.
    super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_head._M_next =
         (_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Fwd_list_impl)0x0;
    nStrings.
    super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_head._M_next =
         (_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Fwd_list_impl)0x0;
    oStrings.
    super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_head._M_next =
         (_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Fwd_list_impl)0x0;
    cStrings.
    super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_head._M_next =
         (_Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Fwd_list_impl)0x0;
    RenX::getCore();
    RenX::Core::getServers();
    bVar10 = false;
    for (plVar12 = local_78; plVar12 != local_70; plVar12 = plVar12 + 1) {
      cVar5 = RenX::Server::isLogChanType((int)*plVar12);
      if (cVar5 != '\0') {
        plVar2 = *(long **)(*plVar12 + 0x30);
        bVar4 = 0;
        for (plVar11 = *(long **)(*plVar12 + 0x28); plVar11 != plVar2; plVar11 = plVar11 + 1) {
          str._M_dataplus._M_p = (pointer)0xf;
          str._M_string_length = (size_type)anon_var_dwarf_f9fd;
          _Var7 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                            ((string *)*plVar11,
                             (basic_string_view<char,_std::char_traits<char>_> *)&str,0);
          bVar3 = 1;
          if (!(bool)(_Var7 == 0 & bVar4)) {
            local_60._M_len = pluginInstance.m_buildingInfoFormat._M_string_length;
            local_60._M_str = pluginInstance.m_buildingInfoFormat._M_dataplus._M_p;
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&str,&local_60,&local_c1);
            RenX::processTags((string *)&str,(Server *)*plVar12,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                              (BuildingInfo *)*plVar11);
            this_00 = &cStrings;
            if (*(char *)(*plVar11 + 0x34) == '\0') {
              iVar1 = *(int *)(*plVar11 + 0x20);
              this_00 = &gStrings;
              if (iVar1 != 0) {
                if (iVar1 == 1) {
                  this_00 = &nStrings;
                }
                else {
                  this_00 = &oStrings;
                }
              }
            }
            std::
            forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_front(this_00,&str);
            bVar3 = _Var7 == 0 | bVar4;
            std::__cxx11::string::~string((string *)&str);
          }
          bVar4 = bVar3;
        }
        while ((_Fwd_list_impl)
               gStrings.
               super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_head._M_next != (_Fwd_list_impl)0x0) {
          std::
          forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front(&gStrings);
          Jupiter::IRC::Client::sendMessage
                    (source,sVar9,pcVar8,
                     *(undefined8 *)
                      ((long)gStrings.
                             super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_head._M_next + 0x10),
                     *(undefined8 *)
                      ((long)gStrings.
                             super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_head._M_next + 8));
        }
        while ((_Fwd_list_impl)
               nStrings.
               super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_head._M_next != (_Fwd_list_impl)0x0) {
          std::
          forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front(&nStrings);
          Jupiter::IRC::Client::sendMessage
                    (source,sVar9,pcVar8,
                     *(undefined8 *)
                      ((long)nStrings.
                             super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_head._M_next + 0x10),
                     *(undefined8 *)
                      ((long)nStrings.
                             super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_head._M_next + 8));
        }
        while ((_Fwd_list_impl)
               oStrings.
               super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_head._M_next != (_Fwd_list_impl)0x0) {
          std::
          forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front(&oStrings);
          Jupiter::IRC::Client::sendMessage
                    (source,sVar9,pcVar8,
                     *(undefined8 *)
                      ((long)oStrings.
                             super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_head._M_next + 0x10),
                     *(undefined8 *)
                      ((long)oStrings.
                             super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_head._M_next + 8));
        }
        while ((_Fwd_list_impl)
               cStrings.
               super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_head._M_next != (_Fwd_list_impl)0x0) {
          std::
          forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front(&cStrings);
          Jupiter::IRC::Client::sendMessage
                    (source,sVar9,pcVar8,
                     *(undefined8 *)
                      ((long)cStrings.
                             super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_head._M_next + 0x10),
                     *(undefined8 *)
                      ((long)cStrings.
                             super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl._M_head._M_next + 8));
        }
        bVar10 = true;
      }
    }
    std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
              ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_78);
    if (!bVar10) {
      Jupiter::IRC::Client::sendMessage
                (source,sVar9,pcVar8,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
    }
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base(&cStrings.
                       super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base(&oStrings.
                       super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base(&nStrings.
                       super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
    std::
    _Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Fwd_list_base(&gStrings.
                       super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
  }
  return;
}

Assistant:

void BuildingInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	int type = chan->getType();
	bool seenStrip;
	bool foundServer{};
	std::forward_list<std::string> gStrings;
	std::forward_list<std::string> nStrings;
	std::forward_list<std::string> oStrings;
	std::forward_list<std::string> cStrings;
	for (const auto& server : RenX::getCore()->getServers()) {
		if (server->isLogChanType(type)) {
			foundServer = true;
			seenStrip = false;
			for (const auto& building : server->buildings){
				if (building->name.find("Rx_Building_Air"sv) == 0) {
					if (seenStrip) {
						continue;
					}

					seenStrip = true;
				}
				std::string str(pluginInstance.getBuildingInfoFormat());
				RenX::processTags(str, server, nullptr, nullptr, building.get());

				if (building->capturable)
					cStrings.push_front(str);
				else if (building->team == RenX::TeamType::GDI)
					gStrings.push_front(str);
				else if (building->team == RenX::TeamType::Nod)
					nStrings.push_front(str);
				else
					oStrings.push_front(str);
			}

			while (gStrings.empty() == false) {
				gStrings.pop_front();
				source->sendMessage(channel, gStrings.front());
			}
			while (nStrings.empty() == false) {
				nStrings.pop_front();
				source->sendMessage(channel, nStrings.front());
			}
			while (oStrings.empty() == false) {
				oStrings.pop_front();
				source->sendMessage(channel, oStrings.front());
			}
			while (cStrings.empty() == false) {
				cStrings.pop_front();
				source->sendMessage(channel, cStrings.front());
			}
		}
	}

	if (!foundServer) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}